

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
GetPropertyEquivalenceInfo
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  bool bVar1;
  PropertyIndex slotIndex;
  PropertyIndex PVar2;
  uint16 uVar3;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSStack_28;
  PropertyIndex absSlotIndex;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyEquivalenceInfo *info_local;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  descriptor = (SimpleDictionaryPropertyDescriptor<unsigned_short> *)info;
  info_local = (PropertyEquivalenceInfo *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar1 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(PropertyRecord **)&info_local,&stack0xffffffffffffffd8);
  if ((bVar1) && ((pSStack_28->Attributes & 8) == 0)) {
    slotIndex = DisallowBigPropertyIndex<unsigned_short>(pSStack_28->propertyIndex);
    PVar2 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,slotIndex);
    *(PropertyIndex *)descriptor = PVar2;
    uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
    *(bool *)&descriptor->propertyIndex = uVar3 < slotIndex;
    *(bool *)((long)&descriptor->propertyIndex + 1) = (pSStack_28->Attributes & 4) != 0;
  }
  else {
    *(undefined2 *)descriptor = 0xffff;
    *(undefined1 *)&descriptor->propertyIndex = 0;
    *(undefined1 *)((long)&descriptor->propertyIndex + 1) = 0;
  }
  return *(short *)descriptor != -1;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            Js::PropertyIndex absSlotIndex = DisallowBigPropertyIndex(descriptor->propertyIndex);
            info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
            info.isAuxSlot = absSlotIndex > GetInlineSlotCapacity();
            info.isWritable = !!(descriptor->Attributes & PropertyWritable);
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isAuxSlot = false;
            info.isWritable = false;
        }
        return info.slotIndex != Constants::NoSlot;
    }